

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  
  pbVar3 = (byte *)ptr;
  if (ptr == end) {
    return -4;
  }
  do {
    if (*pbVar3 - 0xd8 < 4) {
switchD_0015ccfd_caseD_7:
      lVar5 = 4;
    }
    else {
      lVar5 = 2;
      if (*pbVar3 == 0) {
        cVar1 = *(char *)((long)enc[1].scanners + (ulong)pbVar3[1]);
        switch(cVar1) {
        case '\x02':
          *nextTokPtr = (char *)pbVar3;
          return 0;
        case '\x03':
          if (pbVar3 == (byte *)ptr) {
            iVar2 = big2_scanRef(enc,ptr + 2,end,nextTokPtr);
            return iVar2;
          }
          goto LAB_0015cd6b;
        case '\x04':
        case '\x05':
        case '\b':
          break;
        case '\x06':
          lVar5 = 3;
          break;
        case '\a':
          goto switchD_0015ccfd_caseD_7;
        case '\t':
          if (pbVar3 == (byte *)ptr) {
            pcVar4 = ptr + 2;
            if (pcVar4 != end) {
              if ((*pcVar4 == '\0') &&
                 (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\n')) {
                pcVar4 = ptr + 4;
              }
              *nextTokPtr = pcVar4;
              return 7;
            }
            return -3;
          }
          goto LAB_0015cd6b;
        case '\n':
          if (pbVar3 == (byte *)ptr) {
            *nextTokPtr = ptr + 2;
            return 7;
          }
          goto LAB_0015cd6b;
        default:
          if (cVar1 == '\x15') {
            if (pbVar3 == (byte *)ptr) {
              *nextTokPtr = ptr + 2;
              return 0x27;
            }
            goto LAB_0015cd6b;
          }
        }
      }
    }
    pbVar3 = pbVar3 + lVar5;
  } while (pbVar3 != (byte *)end);
LAB_0015cd6b:
  *nextTokPtr = (char *)pbVar3;
  return 6;
}

Assistant:

static
int PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                              const char **nextTokPtr)
{
  const char *start;
  if (ptr == end)
    return XML_TOK_NONE;
  start = ptr;
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}